

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommsInterface.cpp
# Opt level: O1

void __thiscall helics::CommsInterface::~CommsInterface(CommsInterface *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Manager_type p_Var2;
  pointer pcVar3;
  
  this->_vptr_CommsInterface = (_func_int **)&PTR__CommsInterface_0055fe38;
  join_tx_rx_thread(this);
  this_00 = (this->tripDetector).lineDetector.
            super___shared_ptr<const_std::atomic<bool>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if (((this->queue_watcher)._M_id._M_thread == 0) &&
     ((this->queue_transmitter)._M_id._M_thread == 0)) {
    gmlc::containers::
    BlockingPriorityQueue<std::pair<helics::route_id,_helics::ActionMessage>,_std::mutex,_std::condition_variable>
    ::~BlockingPriorityQueue(&this->txQueue);
    p_Var2 = (this->loggingCallback).super__Function_base._M_manager;
    if (p_Var2 != (_Manager_type)0x0) {
      (*p_Var2)((_Any_data *)&this->loggingCallback,(_Any_data *)&this->loggingCallback,
                __destroy_functor);
    }
    p_Var2 = (this->ActionCallback).super__Function_base._M_manager;
    if (p_Var2 != (_Manager_type)0x0) {
      (*p_Var2)((_Any_data *)&this->ActionCallback,(_Any_data *)&this->ActionCallback,
                __destroy_functor);
    }
    std::condition_variable::~condition_variable(&(this->txTrigger).cv_active);
    std::condition_variable::~condition_variable(&(this->txTrigger).cv_trigger);
    pcVar3 = (this->randomID)._M_dataplus._M_p;
    paVar1 = &(this->randomID).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 != paVar1) {
      operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
    }
    pcVar3 = (this->brokerInitString)._M_dataplus._M_p;
    paVar1 = &(this->brokerInitString).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 != paVar1) {
      operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
    }
    pcVar3 = (this->brokerName)._M_dataplus._M_p;
    paVar1 = &(this->brokerName).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 != paVar1) {
      operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
    }
    pcVar3 = (this->brokerTargetAddress)._M_dataplus._M_p;
    paVar1 = &(this->brokerTargetAddress).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 != paVar1) {
      operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
    }
    pcVar3 = (this->localTargetAddress)._M_dataplus._M_p;
    paVar1 = &(this->localTargetAddress).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 != paVar1) {
      operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
    }
    pcVar3 = (this->name)._M_dataplus._M_p;
    paVar1 = &(this->name).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 != paVar1) {
      operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
    }
    std::condition_variable::~condition_variable(&(this->rxTrigger).cv_active);
    std::condition_variable::~condition_variable(&(this->rxTrigger).cv_trigger);
    return;
  }
  std::terminate();
}

Assistant:

CommsInterface::~CommsInterface()
{
    join_tx_rx_thread();
}